

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::checkCanBeSimplified(CheckerVisitor *this,TerExpr *expr)

{
  bool bVar1;
  TreeOp TVar2;
  LiteralKind LVar3;
  int iVar4;
  BinExpr *this_00;
  Node *pNVar5;
  Expr *pEVar6;
  LiteralExpr *pLVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar8;
  void *extraout_RDX_04;
  TerExpr *in_RSI;
  TerExpr *pTVar9;
  CheckerVisitor *in_RDI;
  Expr *t;
  BinExpr *b;
  Expr *checkee;
  Expr *cond;
  CheckerVisitor *in_stack_ffffffffffffffd0;
  BinExpr *in_stack_ffffffffffffffd8;
  Expr *pEVar10;
  BinExpr *this_01;
  
  if ((in_RDI->effectsOnly & 1U) != 0) {
    return;
  }
  pTVar9 = in_RSI;
  this_00 = (BinExpr *)TerExpr::a(in_RSI);
  pEVar10 = (Expr *)0x0;
  TVar2 = Node::op((Node *)this_00);
  pvVar8 = extraout_RDX;
  this_01 = this_00;
  if (TVar2 == TO_NE) {
    pNVar5 = &BinExpr::lhs(this_00)->super_Node;
    TVar2 = Node::op(pNVar5);
    in_stack_ffffffffffffffd8 = this_00;
    if (TVar2 == TO_LITERAL) {
      pEVar6 = BinExpr::lhs(this_00);
      pLVar7 = Expr::asLiteral(pEVar6);
      LVar3 = LiteralExpr::kind(pLVar7);
      in_stack_ffffffffffffffd8 = this_00;
      if (LVar3 == LK_NULL) {
        pEVar10 = BinExpr::rhs(this_00);
        pvVar8 = extraout_RDX_00;
        in_stack_ffffffffffffffd8 = this_00;
        goto LAB_00189a9a;
      }
    }
    pNVar5 = &BinExpr::rhs(in_stack_ffffffffffffffd8)->super_Node;
    TVar2 = Node::op(pNVar5);
    pvVar8 = extraout_RDX_01;
    if (TVar2 == TO_LITERAL) {
      pEVar6 = BinExpr::rhs(in_stack_ffffffffffffffd8);
      pLVar7 = Expr::asLiteral(pEVar6);
      LVar3 = LiteralExpr::kind(pLVar7);
      pvVar8 = extraout_RDX_02;
      if (LVar3 == LK_NULL) {
        pEVar10 = BinExpr::lhs(in_stack_ffffffffffffffd8);
        pvVar8 = extraout_RDX_03;
      }
    }
  }
LAB_00189a9a:
  if (pEVar10 != (Expr *)0x0) {
    iVar4 = TerExpr::c(in_RSI,pTVar9,pvVar8);
    TVar2 = Node::op((Node *)CONCAT44(extraout_var,iVar4));
    if (TVar2 == TO_LITERAL) {
      iVar4 = TerExpr::c(in_RSI,pTVar9,extraout_RDX_04);
      pLVar7 = Expr::asLiteral((Expr *)CONCAT44(extraout_var_00,iVar4));
      LVar3 = LiteralExpr::kind(pLVar7);
      if (LVar3 == LK_NULL) {
        pNVar5 = &maybeEval(in_stack_ffffffffffffffd0,(Expr *)in_RDI,false)->super_Node;
        TerExpr::b(in_RSI);
        maybeEval(in_stack_ffffffffffffffd0,(Expr *)in_RDI,false);
        bVar1 = NodeEqualChecker::check
                          ((NodeEqualChecker *)this_01,pNVar5,(Node *)in_stack_ffffffffffffffd8);
        if (bVar1) {
          report(in_RDI,(Node *)in_RSI,0x79);
        }
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkCanBeSimplified(const TerExpr *expr) {
  if (effectsOnly)
    return;

  const Expr *cond = expr->a();
  const Expr *checkee = nullptr;


  if (cond->op() == TO_NE) {
    const BinExpr *b = static_cast<const BinExpr *>(cond);

    if (b->lhs()->op() == TO_LITERAL && b->lhs()->asLiteral()->kind() == LK_NULL)
      checkee = b->rhs();
    else if (b->rhs()->op() == TO_LITERAL && b->rhs()->asLiteral()->kind() == LK_NULL)
      checkee = b->lhs();
  }

  if (!checkee)
    return;

  if (expr->c()->op() != TO_LITERAL || expr->c()->asLiteral()->kind() != LK_NULL)
    return;

  checkee = maybeEval(checkee);
  const Expr *t = maybeEval(expr->b());

  if (_equalChecker.check(checkee, t)) {
    report(expr, DiagnosticsId::DI_CAN_BE_SIMPLIFIED);
  }
}